

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

bool __thiscall asl::InetAddress::set(InetAddress *this,String *host)

{
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  undefined8 uVar5;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  HostPort hp;
  String s;
  String thehost;
  char local_81;
  HostPort local_80;
  String local_50;
  String local_38;
  
  iVar3 = host->_len;
  String::alloc(&local_38,iVar3);
  uVar5 = local_38.field_2._str;
  if (local_38._size == 0) {
    uVar5 = &local_38.field_2;
  }
  __src = &host->field_2;
  paVar4 = __src;
  if (host->_size != 0) {
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(host->field_2)._str;
  }
  local_38._len = iVar3;
  memcpy((void *)uVar5,paVar4,(long)iVar3 + 1);
  iVar3 = String::indexOf(host,':',0);
  paVar4 = __src;
  if (host->_size != 0) {
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(host->field_2)._str;
  }
  if (((-1 < iVar3) && (paVar4->_space[0] != '[')) &&
     (iVar3 = String::indexOf(host,':',iVar3 + 1), 0 < iVar3)) {
    local_50._size = 0;
    local_50._len = 1;
    local_50.field_2._0_2_ = 0x5b;
    paVar4 = __src;
    if (host->_size != 0) {
      paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(host->field_2)._str;
    }
    String::append(&local_50,paVar4->_space,host->_len);
    local_81 = ']';
    String::concat(&local_80.host,&local_50,&local_81,1);
    uVar5 = local_80.host.field_2._str;
    if (local_80.host._size == 0) {
      uVar5 = &local_80.host.field_2;
    }
    String::assign(&local_38,(char *)uVar5,local_80.host._len);
    if (local_80.host._size != 0) {
      free(local_80.host.field_2._str);
    }
    if (local_50._size != 0) {
      free((void *)CONCAT62(local_50.field_2._2_6_,local_50.field_2._0_2_));
    }
  }
  parseHostPort(&local_80,&local_38);
  if ((local_80.port._len < 1) &&
     ((iVar3 = String::indexOf(&local_80.host,'/',0), -1 < iVar3 ||
      (iVar3 = String::indexOf(&local_80.host,'\\',0), -1 < iVar3)))) {
    Array<unsigned_char>::reserve(&this->_data,0x6e);
    puVar1 = (this->_data)._a;
    puVar1[-0x10] = 'n';
    puVar1[-0xf] = '\0';
    puVar1[-0xe] = '\0';
    puVar1[-0xd] = '\0';
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    if (host->_size != 0) {
      __src = (anon_union_16_2_78e7fdac_for_String_2 *)(host->field_2)._str;
    }
    iVar3 = 0x6b;
    if (host->_len < 0x6b) {
      iVar3 = host->_len;
    }
    memcpy(puVar1 + 2,__src,(long)(iVar3 + 1));
    puVar1[0x6d] = '\0';
    this->_type = LOCAL;
    bVar2 = true;
  }
  else {
    uVar5 = local_80.port.field_2._str;
    if (local_80.port._size == 0) {
      uVar5 = &local_80.port.field_2;
    }
    iVar3 = myatoi((char *)uVar5);
    bVar2 = set(this,&local_80.host,iVar3);
  }
  if (local_80.port._size != 0) {
    free(local_80.port.field_2._str);
  }
  if (local_80.host._size != 0) {
    free(local_80.host.field_2._str);
  }
  if (local_38._size != 0) {
    free(local_38.field_2._str);
  }
  return bVar2;
}

Assistant:

bool InetAddress::set(const String& host)
{
	String thehost = host;
	int c = host.indexOf(':');
	if (host[0] != '[' && c >= 0 && host.indexOf(':', c + 1) > 0)
		thehost = '[' + host + ']';

	HostPort hp = parseHostPort(thehost);
	if (!hp.port.ok() && (hp.host.contains('/') || hp.host.contains('\\')))
	{
#ifdef ASL_SOCKET_LOCAL
		resize(sizeof(sockaddr_un));
		sockaddr_un* a=(sockaddr_un*)ptr();
		a->sun_family=AF_UNIX;
		memcpy(a->sun_path, *host, min((int)sizeof(a->sun_path), host.length() + 1));
		a->sun_path[sizeof(a->sun_path) - 1] = '\0';
		_type = LOCAL;
		return true;
#endif
	}
	return set(hp.host, hp.port);
}